

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMerger->pTask = pTask;
  iVar8 = pMerger->nTree;
  lVar4 = (long)iVar8;
  if (0 < lVar4) {
    lVar7 = 0;
    do {
      iVar8 = iVar8 + -1;
      if (eMode == 2) {
        uVar2 = vdbePmaReaderNext(pMerger->aReadr + iVar8);
      }
      else {
        uVar2 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar7),0);
      }
      if (uVar2 != 0) goto LAB_0015b12e;
      lVar7 = lVar7 + 0x50;
    } while (lVar4 * 0x50 != lVar7);
  }
  iVar8 = pMerger->nTree;
  if (1 < (long)iVar8) {
    iVar6 = iVar8 * 2;
    lVar4 = (long)iVar8 + 1;
    do {
      iVar6 = iVar6 + -2;
      lVar7 = lVar4 + -1;
      iVar8 = pMerger->nTree / 2;
      if (iVar8 < lVar7) {
        iVar9 = iVar6 + iVar8 * -2;
        iVar8 = iVar9 + 1;
      }
      else {
        iVar9 = pMerger->aTree[lVar4 * 2 + -4];
        iVar8 = pMerger->aTree[lVar4 * 2 + -3];
      }
      pPVar1 = pMerger->aReadr;
      iVar5 = iVar8;
      if ((pPVar1[iVar9].pFd != (sqlite3_file *)0x0) &&
         (iVar5 = iVar9, pPVar1[iVar8].pFd != (sqlite3_file *)0x0)) {
        local_3c = 0;
        iVar3 = (*pMerger->pTask->xCompare)
                          (pMerger->pTask,&local_3c,pPVar1[iVar9].aKey,pPVar1[iVar9].nKey,
                           pPVar1[iVar8].aKey,pPVar1[iVar8].nKey);
        iVar5 = iVar8;
        if (iVar3 < 1) {
          iVar5 = iVar9;
        }
      }
      pMerger->aTree[lVar4 + -2] = iVar5;
      lVar4 = lVar7;
    } while (2 < lVar7);
  }
  uVar2 = (uint)pTask->pUnpacked->errCode;
LAB_0015b12e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree;                      /* Number of subtrees to merge */

  /* Failure to allocate the merge would have been detected prior to
  ** invoking this routine */
  assert( pMerger!=0 );

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  nTree = pMerger->nTree;
  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}